

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::LoadObj(attrib_t *attrib,
                     vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     string *warn,string *err,char *filename,char *mtl_basedir,bool trianglulate,
                     bool default_vcols_fallback)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pfVar2;
  pointer psVar3;
  pointer psVar4;
  char cVar5;
  bool bVar6;
  size_t sVar7;
  pointer this;
  char *__s;
  string baseDir;
  MaterialFileReader matFileReader;
  stringstream errss;
  long local_3b0 [14];
  ios_base local_340 [264];
  ifstream ifs;
  byte abStack_218 [488];
  
  pfVar2 = (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  pfVar2 = (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  pfVar2 = (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  pfVar2 = (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar2) {
    (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar2;
  }
  psVar3 = (shapes->super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>)._M_impl
           .super__Vector_impl_data._M_start;
  psVar4 = (shapes->super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  this = psVar3;
  if (psVar4 != psVar3) {
    do {
      shape_t::~shape_t(this);
      this = this + 1;
    } while (this != psVar4);
    (shapes->super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>)._M_impl.
    super__Vector_impl_data._M_finish = psVar3;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&errss);
  std::ifstream::ifstream(&ifs,filename,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0) {
    __s = "";
    if (mtl_basedir != (char *)0x0) {
      __s = mtl_basedir;
    }
    baseDir._M_dataplus._M_p = (pointer)&baseDir.field_2;
    sVar7 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&baseDir,__s,__s + sVar7);
    if ((baseDir._M_string_length != 0) &&
       (baseDir._M_dataplus._M_p[baseDir._M_string_length - 1] != '/')) {
      std::__cxx11::string::push_back((char)&baseDir);
    }
    matFileReader.super_MaterialReader._vptr_MaterialReader =
         (_func_int **)&PTR__MaterialFileReader_00b75198;
    paVar1 = &matFileReader.m_mtlBaseDir.field_2;
    matFileReader.m_mtlBaseDir._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&matFileReader.m_mtlBaseDir,baseDir._M_dataplus._M_p,
               baseDir._M_dataplus._M_p + baseDir._M_string_length);
    bVar6 = LoadObj(attrib,shapes,materials,warn,err,(istream *)&ifs,
                    &matFileReader.super_MaterialReader,trianglulate,default_vcols_fallback);
    matFileReader.super_MaterialReader._vptr_MaterialReader =
         (_func_int **)&PTR__MaterialFileReader_00b75198;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)matFileReader.m_mtlBaseDir._M_dataplus._M_p != paVar1) {
      operator_delete(matFileReader.m_mtlBaseDir._M_dataplus._M_p,
                      matFileReader.m_mtlBaseDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)baseDir._M_dataplus._M_p != &baseDir.field_2) {
      operator_delete(baseDir._M_dataplus._M_p,baseDir.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Cannot open file [",0x12);
    if (filename == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_3b0 + (int)*(undefined8 *)(local_3b0[0] + -0x18));
    }
    else {
      sVar7 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,filename,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,"]",1);
    cVar5 = (char)(ostream *)local_3b0;
    std::ios::widen((char)*(undefined8 *)(local_3b0[0] + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    if (err != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)err,(string *)&matFileReader);
      if (matFileReader.super_MaterialReader._vptr_MaterialReader !=
          (_func_int **)&matFileReader.m_mtlBaseDir._M_string_length) {
        operator_delete(matFileReader.super_MaterialReader._vptr_MaterialReader,
                        matFileReader.m_mtlBaseDir._M_string_length + 1);
      }
    }
    bVar6 = false;
  }
  std::ifstream::~ifstream(&ifs);
  std::__cxx11::stringstream::~stringstream((stringstream *)&errss);
  std::ios_base::~ios_base(local_340);
  return bVar6;
}

Assistant:

bool LoadObj(attrib_t *attrib, std::vector<shape_t> *shapes,
             std::vector<material_t> *materials, std::string *warn,
             std::string *err, const char *filename, const char *mtl_basedir,
             bool trianglulate, bool default_vcols_fallback) {
  attrib->vertices.clear();
  attrib->normals.clear();
  attrib->texcoords.clear();
  attrib->colors.clear();
  shapes->clear();

  std::stringstream errss;

  std::ifstream ifs(filename);
  if (!ifs) {
    errss << "Cannot open file [" << filename << "]" << std::endl;
    if (err) {
      (*err) = errss.str();
    }
    return false;
  }

  std::string baseDir = mtl_basedir ? mtl_basedir : "";
  if (!baseDir.empty()) {
#ifndef _WIN32
    const char dirsep = '/';
#else
    const char dirsep = '\\';
#endif
    if (baseDir[baseDir.length() - 1] != dirsep) baseDir += dirsep;
  }
  MaterialFileReader matFileReader(baseDir);

  return LoadObj(attrib, shapes, materials, warn, err, &ifs, &matFileReader,
                 trianglulate, default_vcols_fallback);
}